

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void com_ipred_c(pel *dst,int i_dst,pel *src,pel *luma,s16 *tmp_dst,int ipm_c,int ipm,int w,int h,
                int bit_depth,u16 avail_cu,pel *piRecoY,int uiStrideY)

{
  int local_4c;
  int local_48;
  int local_44;
  int ipm_c_local;
  s16 *tmp_dst_local;
  pel *luma_local;
  pel *src_local;
  int i_dst_local;
  pel *dst_local;
  
  local_44 = ipm_c;
  if ((ipm_c == 0) && ((((ipm == 0xc || (ipm == 0x18)) || (ipm == 0)) || (ipm == 2)))) {
    if (ipm == 0xc) {
      local_48 = 3;
    }
    else {
      if (ipm == 0x18) {
        local_4c = 2;
      }
      else {
        local_4c = 4;
        if (ipm == 0) {
          local_4c = 1;
        }
      }
      local_48 = local_4c;
    }
    local_44 = local_48;
  }
  switch(local_44) {
  case 0:
    if (ipm == 1) {
      (*uavs3d_funs_handle.intra_pred_plane[1])(src,dst,i_dst,w,h,bit_depth);
    }
    else {
      (*uavs3d_funs_handle.intra_pred_chroma_ang[ipm])(src,dst,i_dst,ipm,w,h);
    }
    break;
  case 1:
    (*uavs3d_funs_handle.intra_pred_dc[1])(src,dst,i_dst,w,h,avail_cu,bit_depth);
    break;
  case 2:
    (*uavs3d_funs_handle.intra_pred_hor[1])(src + -2,dst,i_dst,w,h);
    break;
  case 3:
    (*uavs3d_funs_handle.intra_pred_ver[1])(src + 2,dst,i_dst,w << 1,h);
    break;
  case 4:
    (*uavs3d_funs_handle.intra_pred_bi[1])(src,dst,i_dst,w,h,bit_depth);
    break;
  case 5:
    ipred_tscpm(dst,i_dst,src,luma,piRecoY,uiStrideY,w,h,avail_cu & 1,avail_cu & 2,bit_depth);
    break;
  default:
    printf("\n illegal chroma intra prediction mode\n");
  }
  return;
}

Assistant:

void com_ipred_c(pel *dst, int i_dst, pel *src, pel *luma, s16 *tmp_dst, int ipm_c, int ipm, int w, int h, int bit_depth, u16 avail_cu, pel *piRecoY, int uiStrideY)
{
    uavs3d_assert(w <= 64 && h <= 64);

    if(ipm_c == IPD_DM_C && COM_IPRED_CHK_CONV(ipm)) {
        ipm_c = (ipm == IPD_VER) ? IPD_VER_C : (ipm == IPD_HOR ? IPD_HOR_C : (ipm == IPD_DC ? IPD_DC_C : IPD_BI_C));
    }

    switch(ipm_c) {
    case IPD_DM_C:
        switch(ipm) {
        case IPD_PLN:
            uavs3d_funs_handle.intra_pred_plane[UV_C](src, dst, i_dst, w, h, bit_depth);
            break;
        default:
            uavs3d_funs_handle.intra_pred_chroma_ang[ipm](src, dst, i_dst, ipm, w, h);
            break;
        }
        break;
    case IPD_DC_C:
        uavs3d_funs_handle.intra_pred_dc[UV_C](src, dst, i_dst, w, h, avail_cu, bit_depth);
        break;
    case IPD_HOR_C:
        uavs3d_funs_handle.intra_pred_hor[UV_C](src - 2, dst, i_dst, w, h);
        break;
    case IPD_VER_C:
        uavs3d_funs_handle.intra_pred_ver[UV_C](src + 2, dst, i_dst, w << 1, h);
        break;
    case IPD_BI_C:
        uavs3d_funs_handle.intra_pred_bi[UV_C](src, dst, i_dst, w, h, bit_depth);
        break;
    case IPD_TSCPM_C:
        ipred_tscpm(dst, i_dst, src, luma, piRecoY, uiStrideY, w,  h, IS_AVAIL(avail_cu, AVAIL_UP), IS_AVAIL(avail_cu, AVAIL_LE), bit_depth);
        break;

    default:
        printf("\n illegal chroma intra prediction mode\n");
        break;
    }
}